

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdialogbuttonbox.cpp
# Opt level: O0

void __thiscall QDialogButtonBoxPrivate::retranslateStrings(QDialogButtonBoxPrivate *this)

{
  bool bVar1;
  QPlatformTheme *pQVar2;
  QFlatMap<QPushButton_*,_QDialogButtonBox::StandardButton,_std::less<QPushButton_*>,_QVarLengthArray<QPushButton_*,_8LL>,_QVarLengthArray<QDialogButtonBox::StandardButton,_8LL>_>
  *in_RDI;
  long in_FS_OFFSET;
  reference *it;
  add_const_t<QFlatMap<QPushButton_*,_QDialogButtonBox::StandardButton,_std::less<QPushButton_*>,_QVarLengthArray<QPushButton_*,_8LL>,_QVarLengthArray<QDialogButtonBox::StandardButton,_8LL>_>_>
  *__range1;
  QString text;
  const_iterator __end1;
  const_iterator __begin1;
  const_iterator *in_stack_ffffffffffffff98;
  const_iterator *this_00;
  undefined1 *local_50;
  const_iterator *in_stack_ffffffffffffffb8;
  const_iterator local_38;
  const_iterator local_28;
  const_iterator local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (const_iterator *)
            &in_RDI[5].c.values.super_QVLABase<QDialogButtonBox::StandardButton>.super_QVLABaseBase.
             s;
  local_18.i = (size_type)&DAT_aaaaaaaaaaaaaaaa;
  local_18.c = (containers *)&DAT_aaaaaaaaaaaaaaaa;
  local_18 = QFlatMap<QPushButton_*,_QDialogButtonBox::StandardButton,_std::less<QPushButton_*>,_QVarLengthArray<QPushButton_*,_8LL>,_QVarLengthArray<QDialogButtonBox::StandardButton,_8LL>_>
             ::begin(in_RDI);
  local_28.i = (size_type)&DAT_aaaaaaaaaaaaaaaa;
  local_28.c = (containers *)&DAT_aaaaaaaaaaaaaaaa;
  local_28 = QFlatMap<QPushButton_*,_QDialogButtonBox::StandardButton,_std::less<QPushButton_*>,_QVarLengthArray<QPushButton_*,_8LL>,_QVarLengthArray<QDialogButtonBox::StandardButton,_8LL>_>
             ::end(in_RDI);
  while( true ) {
    bVar1 = QFlatMap<QPushButton_*,_QDialogButtonBox::StandardButton,_std::less<QPushButton_*>,_QVarLengthArray<QPushButton_*,_8LL>,_QVarLengthArray<QDialogButtonBox::StandardButton,_8LL>_>
            ::const_iterator::operator!=(this_00,in_stack_ffffffffffffff98);
    if (!bVar1) break;
    local_38 = (const_iterator)
               QFlatMap<QPushButton_*,_QDialogButtonBox::StandardButton,_std::less<QPushButton_*>,_QVarLengthArray<QPushButton_*,_8LL>,_QVarLengthArray<QDialogButtonBox::StandardButton,_8LL>_>
               ::const_iterator::operator*(in_stack_ffffffffffffffb8);
    in_stack_ffffffffffffff98 = &local_38;
    local_50 = &DAT_aaaaaaaaaaaaaaaa;
    in_stack_ffffffffffffffb8 = (const_iterator *)&DAT_aaaaaaaaaaaaaaaa;
    pQVar2 = QGuiApplicationPrivate::platformTheme();
    (**(code **)(*(long *)pQVar2 + 0x88))
              (&local_50,pQVar2,*(undefined4 *)in_stack_ffffffffffffff98->i);
    bVar1 = QString::isEmpty((QString *)0x66cf53);
    if (!bVar1) {
      QAbstractButton::setText((QAbstractButton *)in_RDI,(QString *)this_00);
    }
    QString::~QString((QString *)0x66cf75);
    QFlatMap<QPushButton_*,_QDialogButtonBox::StandardButton,_std::less<QPushButton_*>,_QVarLengthArray<QPushButton_*,_8LL>,_QVarLengthArray<QDialogButtonBox::StandardButton,_8LL>_>
    ::const_iterator::operator++(&local_18);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDialogButtonBoxPrivate::retranslateStrings()
{
    for (const auto &it : std::as_const(standardButtonMap)) {
        const QString text = QGuiApplicationPrivate::platformTheme()->standardButtonText(it.second);
        if (!text.isEmpty())
            it.first->setText(text);
    }
}